

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O3

HT_ErrorCode ht_stack_push(HT_Stack *stack,void *data,size_t size)

{
  HT_ErrorCode HVar1;
  void *pvVar2;
  long lVar3;
  size_t size_00;
  
  pvVar2 = (void *)stack->size;
  if (stack->capacity - (long)pvVar2 < size) {
    lVar3 = 2;
    do {
      size_00 = lVar3 * stack->capacity;
      lVar3 = lVar3 * 2;
    } while (size_00 - (long)pvVar2 < size);
    pvVar2 = ht_realloc(stack->data,size_00);
    if (pvVar2 == (void *)0x0) {
      return HT_ERR_OUT_OF_MEMORY;
    }
    stack->data = pvVar2;
    stack->capacity = size_00;
    pvVar2 = (void *)stack->size;
  }
  HVar1 = ht_bag_void_ptr_add(&stack->sizes_stack,pvVar2);
  if (HVar1 == HT_ERR_OK) {
    memcpy((void *)((long)stack->data + stack->size),data,size);
    stack->size = stack->size + size;
    HVar1 = HT_ERR_OK;
  }
  return HVar1;
}

Assistant:

HT_ErrorCode
ht_stack_push(HT_Stack* stack, void* data, size_t size)
{
    HT_ErrorCode bag_err_code = HT_ERR_OK;

    if (stack->capacity - stack->size < size)
    {
        size_t factor = 2;
        while (stack->capacity * factor - stack->size < size)
        {
            factor *= 2;
        }
        if (!_ht_stack_resize(stack, stack->capacity * factor))
        {
            return HT_ERR_OUT_OF_MEMORY;
        }
    }

    bag_err_code = ht_bag_void_ptr_add(&stack->sizes_stack, (void*)stack->size);
    if (bag_err_code != HT_ERR_OK)
    {
        return bag_err_code;
    }

    memcpy(HT_PTR_ADD(stack->data, stack->size), data, size);
    stack->size += size;

    return HT_ERR_OK;
}